

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URResolution.cpp
# Opt level: O3

Clause * __thiscall Inferences::URResolution::Item::generateClause(Item *this)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  UnitList *pUVar4;
  Literal *l;
  Clause *pCVar5;
  uint uVar6;
  Literal *pLVar7;
  VirtualIterator<Kernel::Literal_*> VVar8;
  ulong uVar9;
  LiteralIterator it;
  Inference inf;
  VirtualIterator<Kernel::Literal_*> local_a0;
  VirtualIterator<Kernel::Literal_*> local_98;
  UnitList *local_90;
  IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal_*>,_Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal_*>_>_>_>
  local_88;
  FixedSizeAllocator<16UL> *local_68;
  Inference local_60;
  
  pCVar5 = this->_orig;
  local_68 = (FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18);
  local_90 = (UnitList *)
             Lib::FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  local_90->_head = &pCVar5->super_Unit;
  local_90->_tail = (List<Kernel::Unit_*> *)0x0;
  uVar3 = (ulong)((long)(this->_lits)._cursor - (long)(this->_lits)._stack) >> 3;
  if ((int)uVar3 == 0) {
    l = (Literal *)0x0;
  }
  else {
    uVar9 = 0;
    pLVar7 = (Literal *)0x0;
    do {
      l = (this->_lits)._stack[uVar9];
      if (l == (Literal *)0x0) {
        pCVar5 = (this->_premises)._array[uVar9];
        pUVar4 = (UnitList *)Lib::FixedSizeAllocator<16UL>::alloc(local_68);
        pUVar4->_head = &pCVar5->super_Unit;
        pUVar4->_tail = local_90;
        local_90 = pUVar4;
        l = pLVar7;
      }
      uVar9 = uVar9 + 1;
      pLVar7 = l;
    } while ((uVar3 & 0xffffffff) != uVar9);
  }
  local_98._core._0_1_ = 0x45;
  Kernel::Inference::Inference(&local_60,(GeneratingInferenceMany *)&local_98);
  pLVar7 = this->_ansLit;
  if (pLVar7 == (Literal *)0x0) {
    Lib::VirtualIterator<Kernel::Literal_*>::getEmpty();
  }
  else {
    local_98._core =
         (IteratorCore<Kernel::Literal_*> *)
         Lib::FixedSizeAllocator<32UL>::alloc
                   ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    (local_98._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_00b3ae38;
    *(undefined1 *)&local_98._core[1]._vptr_IteratorCore = 0;
    *(Literal **)&local_98._core[1]._refCnt = pLVar7;
    (local_98._core)->_refCnt = 1;
  }
  if (l == (Literal *)0x0) {
    local_a0._core = local_98._core;
    if (local_98._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
      (local_98._core)->_refCnt = (local_98._core)->_refCnt + 1;
    }
    pCVar5 = Kernel::Clause::fromIterator<Lib::VirtualIterator<Kernel::Literal*>>
                       (&local_a0,&local_60);
    VVar8._core = local_a0._core;
    goto LAB_00514d5d;
  }
  pLVar7 = this->_ansLit;
  if (pLVar7 == (Literal *)0x0) {
LAB_00514c3d:
    l = Kernel::Renaming::normalize(l);
  }
  else {
    iVar2 = 0;
    if (*(int *)&(pLVar7->super_Term).field_0xc < 0) {
      iVar2 = 0;
      do {
        pLVar7 = *(Literal **)&(pLVar7->super_Term).field_9._vars;
        if (((ulong)pLVar7 & 1) != 0) {
          uVar6 = 3;
          goto LAB_00514c39;
        }
        iVar2 = iVar2 + 2;
      } while (*(int *)&(pLVar7->super_Term).field_0xc < 0);
    }
    uVar6 = (pLVar7->super_Term).field_9._vars;
LAB_00514c39:
    if (iVar2 + uVar6 == 0) goto LAB_00514c3d;
  }
  VVar8._core = local_98._core;
  local_88._iter._it1._el = l;
  if (local_98._core == (IteratorCore<Kernel::Literal_*> *)0x0) {
    local_88._iter._first = true;
    local_88._iter._it1._finished = false;
    local_88._iter._it2._iter._core =
         (VirtualIterator<Kernel::Literal_*>)(IteratorCore<Kernel::Literal_*> *)0x0;
  }
  else {
    iVar2 = (local_98._core)->_refCnt + 4;
    (local_98._core)->_refCnt = iVar2;
    if (iVar2 == 0) {
      (*(local_98._core)->_vptr_IteratorCore[1])(local_98._core);
      iVar2 = (VVar8._core)->_refCnt;
    }
    (VVar8._core)->_refCnt = iVar2 + -1;
    if (iVar2 + -1 == 0) {
      (*(VVar8._core)->_vptr_IteratorCore[1])(VVar8._core);
      iVar2 = (VVar8._core)->_refCnt + 1;
    }
    local_88._iter._first = true;
    local_88._iter._it1._finished = false;
    local_88._iter._it2._iter._core =
         (VirtualIterator<Kernel::Literal_*>)(VirtualIterator<Kernel::Literal_*>)VVar8._core;
    (VVar8._core)->_refCnt = iVar2 + 1;
    if (iVar2 + 1 == 0) {
      (*(VVar8._core)->_vptr_IteratorCore[1])(VVar8._core);
      iVar2 = (VVar8._core)->_refCnt + -1;
    }
    (VVar8._core)->_refCnt = iVar2;
    if (iVar2 == 0) {
      (*(VVar8._core)->_vptr_IteratorCore[1])(VVar8._core);
      iVar2 = (VVar8._core)->_refCnt;
    }
    iVar2 = iVar2 + -1;
    (VVar8._core)->_refCnt = iVar2;
    if (iVar2 == 0) {
      (*(VVar8._core)->_vptr_IteratorCore[1])(VVar8._core);
      iVar2 = (VVar8._core)->_refCnt;
    }
    (VVar8._core)->_refCnt = iVar2 + -1;
    if (iVar2 + -1 == 0) {
      (*(VVar8._core)->_vptr_IteratorCore[1])(VVar8._core);
    }
  }
  pCVar5 = Kernel::Clause::
           fromIterator<Lib::IterTraits<Lib::CatIterator<Lib::SingletonIterator<Kernel::Literal*>,Lib::IterTraits<Lib::VirtualIterator<Kernel::Literal*>>>>>
                     (&local_88,&local_60);
  if (local_88._iter._it2._iter._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
    piVar1 = (int *)((long)local_88._iter._it2._iter._core + 8);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)local_88._iter._it2._iter._core + 8))();
    }
  }
LAB_00514d5d:
  if (VVar8._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
    piVar1 = &(VVar8._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(VVar8._core)->_vptr_IteratorCore[1])(VVar8._core);
    }
  }
  if (local_98._core != (IteratorCore<Kernel::Literal_*> *)0x0) {
    piVar1 = &(local_98._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_98._core)->_vptr_IteratorCore[1])();
    }
  }
  return pCVar5;
}

Assistant:

Clause* generateClause() const
  {
    UnitList* premLst = 0;
    UnitList::push(_orig, premLst);
    Literal* single = 0;
    unsigned clen = _lits.size();
    for(unsigned i=0; i<clen; i++) {
      if(_lits[i]!=0) {
        ASS_EQ(single,0);
        ASS_EQ(_premises[i],0);
        single = _lits[i];
      }
      else {
        Clause* premise = _premises[i];
        ASS(premise);
        UnitList::push(premise, premLst);
      }
    }

    Inference inf(GeneratingInferenceMany(InferenceRule::UNIT_RESULTING_RESOLUTION, premLst));
    Clause* res;

    LiteralIterator it = _ansLit ? pvi(getSingletonIterator(_ansLit)) : LiteralIterator::getEmpty();
    if(single) {
      if (!_ansLit || _ansLit->ground()) {
        single = Renaming::normalize(single);
      }
      res = Clause::fromIterator(concatIters(getSingletonIterator(single), it), inf);
    }
    else {
      res = Clause::fromIterator(it, inf);
    }
    return res;
  }